

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

bool __thiscall pugi::xml_text::as_bool(xml_text *this,bool def)

{
  byte bVar1;
  xml_node_struct *pxVar2;
  uint uVar3;
  
  pxVar2 = _data(this);
  if ((pxVar2 != (xml_node_struct *)0x0) && ((byte *)pxVar2->value != (byte *)0x0)) {
    bVar1 = *pxVar2->value;
    def = true;
    uVar3 = bVar1 - 0x54;
    if (((0x25 < uVar3) || ((0x2100000021U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) && (bVar1 != 0x31))
    {
      def = false;
    }
  }
  return def;
}

Assistant:

PUGI_IMPL_FN bool xml_text::as_bool(bool def) const
	{
		xml_node_struct* d = _data();
		if (!d) return def;
		const char_t* value = d->value;
		return value ? impl::get_value_bool(value) : def;
	}